

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_interfaces.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::GetLocationsForVariable
          (ValidationState_t *_,Instruction *entry_point,Instruction *variable,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *locations,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *output_index1_locations)

{
  uint16_t uVar1;
  long *plVar2;
  __node_base_ptr p_Var3;
  uint uVar4;
  bool bVar5;
  StorageClass SVar6;
  uint uVar7;
  ExecutionModel EVar8;
  uint uVar9;
  spv_result_t sVar10;
  uint32_t uVar11;
  Instruction *pIVar12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  __node_base_ptr p_Var15;
  _Hash_node_base *p_Var16;
  _Rb_tree_color *p_Var17;
  long *plVar18;
  Instruction *type;
  undefined4 extraout_var;
  size_type sVar19;
  mapped_type *pmVar20;
  uint uVar21;
  int iVar22;
  uint7 uVar23;
  long lVar24;
  spv_result_t sVar25;
  _Rb_tree_color _Var26;
  ValidationState_t *pVVar27;
  _Head_base<2UL,_unsigned_int,_false> _Var28;
  char *pcVar29;
  int iVar30;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  __node_base_ptr p_Var31;
  long *plVar32;
  _Rb_tree_header *p_Var33;
  ulong uVar34;
  size_t index;
  ulong uVar35;
  _Tuple_impl<2UL,_unsigned_int> _Var36;
  __hash_code __code;
  byte bVar37;
  bool bVar38;
  undefined1 uVar39;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar40;
  uint32_t check;
  __hashtable *__h;
  uint32_t num_locations_1;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  member_locations;
  string storage_class;
  uint32_t num_locations;
  uint local_34c;
  ValidationState_t *local_348;
  byte local_339;
  Instruction *local_338;
  Instruction *local_330;
  _Tuple_impl<1UL,_bool,_unsigned_int> local_328;
  _Tuple_impl<2UL,_unsigned_int> local_320;
  int local_31c;
  ulong local_318;
  uint32_t local_30c;
  ulong local_308;
  ulong local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  string local_2e8;
  ulong local_2c8;
  Instruction *local_2c0;
  ulong local_2b8;
  undefined1 local_2b0 [32];
  float local_290;
  size_t local_288;
  __node_base_ptr p_Stack_280;
  StorageClass local_278;
  ExecutionModel local_274;
  long *local_270;
  long local_268;
  long local_260 [2];
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *local_250;
  _Tuple_impl<1UL,_bool,_unsigned_int> local_248;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_240;
  undefined1 local_208 [5];
  char cStack_203;
  spv_result_t local_38;
  
  local_2c0 = entry_point;
  local_248 = (_Tuple_impl<1UL,_bool,_unsigned_int>)output_index1_locations;
  local_274 = Instruction::GetOperandAs<spv::ExecutionModel>(entry_point,0);
  SVar6 = Instruction::GetOperandAs<spv::StorageClass>(variable,2);
  local_339 = SVar6 != Output;
  uVar7 = Instruction::GetOperandAs<unsigned_int>(variable,0);
  pIVar12 = ValidationState_t::FindDef(_,uVar7);
  local_320.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
       (_Head_base<2UL,_unsigned_int,_false>)Instruction::GetOperandAs<unsigned_int>(pIVar12,2);
  pIVar12 = ValidationState_t::FindDef
                      (_,(uint32_t)local_320.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl
                      );
  local_208._0_4_ = (variable->inst_).result_id;
  local_250 = &_->id_decorations_;
  local_348 = _;
  local_330 = variable;
  pmVar13 = std::
            map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
            ::operator[](local_250,(key_type_conflict *)local_208);
  EVar8 = local_274;
  p_Var14 = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var33 = &(pmVar13->_M_t)._M_impl.super__Rb_tree_header;
  bVar38 = (_Rb_tree_header *)p_Var14 == p_Var33;
  local_328 = (_Tuple_impl<1UL,_bool,_unsigned_int>)locations;
  if (bVar38) {
    local_308 = 0;
    uVar34 = 1;
    local_2b8 = 0;
    uVar35 = 1;
    local_2f0 = (ulong)local_2f0._4_4_ << 0x20;
    bVar37 = 0;
  }
  else {
    local_31c = CONCAT31(local_31c._1_3_,local_274 != ExecutionModelFragment || SVar6 != Output);
    local_2f8 = 0;
    local_2f0 = (ulong)local_2f0._4_4_ << 0x20;
    local_308 = 0;
    local_300 = 0;
    local_2c8 = local_2c8 & 0xffffffff00000000;
    local_338 = (Instruction *)0x0;
    local_318 = 0;
    local_2b8 = 0;
    local_278 = SVar6;
    do {
      pVVar27 = local_348;
      _Var26 = p_Var14[1]._M_color;
      uVar23 = (uint7)(uint3)(EVar8 >> 8);
      if ((int)_Var26 < 0x1f) {
        if (_Var26 == 0xb) {
          bVar5 = false;
          _ = (ValidationState_t *)0x0;
        }
        else if (_Var26 == 0xf) {
          bVar5 = true;
          local_338 = (Instruction *)CONCAT71(uVar23,1);
        }
        else {
          if (_Var26 != 0x1e) goto LAB_001de066;
          local_2f0 = CONCAT44(local_2f0._4_4_,(p_Var14[1]._M_parent)->_M_color);
          bVar5 = true;
          local_2f8 = CONCAT71(uVar23,1);
        }
      }
      else {
        if ((int)_Var26 < 0x1499) {
          if (_Var26 == 0x1f) {
            local_308 = (ulong)(p_Var14[1]._M_parent)->_M_color;
          }
          else if (_Var26 == 0x20) {
            if ((char)local_31c == '\0') {
              local_2c8 = CONCAT44(local_2c8._4_4_,(p_Var14[1]._M_parent)->_M_color);
              bVar5 = true;
              local_300 = CONCAT71(uVar23,1);
              goto LAB_001de166;
            }
            ValidationState_t::diag
                      ((DiagnosticStream *)local_208,local_348,SPV_ERROR_INVALID_DATA,local_330);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Index can only be applied to Fragment output variables"
                       ,0x36);
            sVar25 = local_38;
LAB_001de15f:
            _ = (ValidationState_t *)(ulong)(uint)sVar25;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            bVar5 = false;
            goto LAB_001de166;
          }
        }
        else {
          if (_Var26 == 0x1499) {
            bVar5 = true;
            local_318 = CONCAT71(uVar23,1);
            goto LAB_001de166;
          }
          if (_Var26 == 0x14a5) {
            if (EVar8 == ExecutionModelFragment) {
              uVar7 = (pIVar12->inst_).opcode & 0xfffffffe;
              bVar5 = true;
              if ((short)uVar7 == 0x1c) {
                local_2b8 = CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
                goto LAB_001de166;
              }
              ValidationState_t::diag
                        ((DiagnosticStream *)local_208,local_348,SPV_ERROR_INVALID_DATA,local_330);
              ValidationState_t::VkErrorID_abi_cxx11_
                        ((string *)local_2b0,pVVar27,0x1a7a,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,(char *)local_2b0._0_8_,local_2b0._8_8_);
              lVar24 = 0x27;
              pcVar29 = "PerVertexKHR must be declared as arrays";
            }
            else {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_208,local_348,SPV_ERROR_INVALID_DATA,local_330);
              ValidationState_t::VkErrorID_abi_cxx11_
                        ((string *)local_2b0,pVVar27,0x1a79,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,(char *)local_2b0._0_8_,local_2b0._8_8_);
              lVar24 = 0x3d;
              pcVar29 = "PerVertexKHR can only be applied to Fragment Execution Models";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar29,lVar24);
            sVar25 = local_38;
            if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
              operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
            }
            goto LAB_001de15f;
          }
        }
LAB_001de066:
        bVar5 = true;
      }
LAB_001de166:
      if (!bVar5) break;
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      bVar38 = (_Rb_tree_header *)p_Var14 == p_Var33;
    } while (!bVar38);
    uVar34 = (ulong)(byte)((byte)local_318 ^ 1);
    uVar35 = (ulong)(byte)((byte)local_338 ^ 1);
    locations = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_248;
    if ((int)local_2c8 != 1) {
      locations = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_328;
    }
    if ((local_300 & 1) == 0) {
      locations = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_328;
    }
    bVar37 = (byte)local_2f8;
    SVar6 = local_278;
  }
  if (!bVar38) {
    return (spv_result_t)_;
  }
  EVar8 = Instruction::GetOperandAs<spv::ExecutionModel>(local_2c0,0);
  pVVar27 = local_348;
  local_338 = (Instruction *)CONCAT44(local_338._4_4_,(spv_result_t)_);
  if (3 < EVar8 - ExecutionModelTessellationControl) {
    if ((EVar8 != ExecutionModelMeshNV) || (SVar6 != Output)) goto LAB_001de2a2;
    goto switchD_001de22b_caseD_3;
  }
  uVar34 = (ulong)local_339;
  switch(EVar8) {
  case ExecutionModelTessellationControl:
    uVar34 = uVar35;
    break;
  case ExecutionModelTessellationEvaluation:
    goto LAB_001de261;
  case ExecutionModelFragment:
    uVar35 = local_2b8;
LAB_001de261:
    uVar34 = uVar35;
    if (SVar6 == Output) goto LAB_001de2a2;
  }
switchD_001de22b_caseD_3:
  if (((uVar34 & 1) != 0) && (((pIVar12->inst_).opcode & 0xfffe) == 0x1c)) {
    local_320.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
         (_Head_base<2UL,_unsigned_int,_false>)Instruction::GetOperandAs<unsigned_int>(pIVar12,1);
    pIVar12 = ValidationState_t::FindDef
                        (pVVar27,(uint32_t)
                                 local_320.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl);
  }
LAB_001de2a2:
  if (((pIVar12->inst_).opcode == 0x1e) &&
     (bVar38 = ValidationState_t::HasDecoration
                         (pVVar27,(uint32_t)
                                  local_320.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl,
                          BuiltIn), bVar38)) {
    return SPV_SUCCESS;
  }
  bVar38 = ValidationState_t::HasDecoration
                     (pVVar27,(uint32_t)
                              local_320.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl,
                      Block);
  if (!bVar38 && (bVar37 & 1) == 0) {
    uVar1 = (pIVar12->inst_).opcode;
    ValidationState_t::diag((DiagnosticStream *)local_208,pVVar27,SPV_ERROR_INVALID_DATA,local_330);
    ValidationState_t::VkErrorID_abi_cxx11_
              ((string *)local_2b0,pVVar27,uVar1 == 0x1e | 0x1334,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(char *)local_2b0._0_8_,local_2b0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Variable must be decorated with a location",0x2a);
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
    }
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    return local_38;
  }
  pcVar29 = "output";
  if (SVar6 != Output) {
    pcVar29 = "input";
  }
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_270,pcVar29,pcVar29 + (6 - (ulong)(SVar6 != Output)));
  if ((bVar37 & 1) == 0) {
    local_2b0._0_8_ = &p_Stack_280;
    local_2b0._8_8_ = 1;
    local_2b0._16_8_ = 0;
    local_2b0._24_8_ = 0;
    local_290 = 1.0;
    local_288 = 0;
    p_Stack_280 = (__node_base_ptr)0x0;
    local_240._M_buckets = &local_240._M_single_bucket;
    local_240._M_bucket_count = 1;
    local_240._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_240._M_element_count = 0;
    local_240._M_rehash_policy._M_max_load_factor = 1.0;
    local_240._M_rehash_policy._M_next_resize = 0;
    local_240._M_single_bucket = (__node_base_ptr)0x0;
    local_208._0_4_ = local_320.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
    pmVar13 = std::
              map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
              ::operator[](local_250,(key_type_conflict *)local_208);
    p_Var14 = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var33 = &(pmVar13->_M_t)._M_impl.super__Rb_tree_header;
    bVar38 = (_Rb_tree_header *)p_Var14 == p_Var33;
    if (!bVar38) {
      do {
        if (p_Var14[1]._M_color == 0x1f) {
          _Var28._M_head_impl = p_Var14[2]._M_color;
          p_Var3 = local_240._M_buckets[(ulong)_Var28._M_head_impl % local_240._M_bucket_count];
          p_Var15 = (__node_base_ptr)0x0;
          if ((p_Var3 != (__node_base_ptr)0x0) &&
             (p_Var15 = p_Var3, p_Var31 = p_Var3->_M_nxt,
             _Var28._M_head_impl != *(_Rb_tree_color *)&p_Var3->_M_nxt[1]._M_nxt)) {
            while (p_Var16 = p_Var31->_M_nxt, p_Var16 != (_Hash_node_base *)0x0) {
              p_Var15 = (__node_base_ptr)0x0;
              if (((ulong)*(_Rb_tree_color *)&p_Var16[1]._M_nxt % local_240._M_bucket_count !=
                   (ulong)_Var28._M_head_impl % local_240._M_bucket_count) ||
                 (p_Var15 = p_Var31, p_Var31 = p_Var16,
                 _Var28._M_head_impl == *(_Rb_tree_color *)&p_Var16[1]._M_nxt)) goto LAB_001de635;
            }
            p_Var15 = (__node_base_ptr)0x0;
          }
LAB_001de635:
          if (p_Var15 == (__node_base_ptr)0x0) {
            p_Var16 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var16 = p_Var15->_M_nxt;
          }
          if (p_Var16 == (_Hash_node_base *)0x0) {
            _Var26 = (p_Var14[1]._M_parent)->_M_color;
            this = &local_240;
LAB_001de6cb:
            local_208._0_4_ = _Var28._M_head_impl;
            p_Var17 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this,(key_type *)local_208);
            *p_Var17 = _Var26;
            bVar5 = true;
            pVVar27 = local_348;
          }
          else {
            bVar5 = true;
            if (*(_Rb_tree_color *)((long)&p_Var16[1]._M_nxt + 4) !=
                (p_Var14[1]._M_parent)->_M_color) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_208,pVVar27,SPV_ERROR_INVALID_DATA,pIVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Member index ",0xd);
              std::ostream::operator<<((DiagnosticStream *)local_208,p_Var14[2]._M_color);
              lVar24 = 0x26;
              pcVar29 = " has conflicting component assignments";
LAB_001de69a:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,pcVar29,lVar24);
              local_338 = (Instruction *)CONCAT44(local_338._4_4_,local_38);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
              bVar5 = false;
            }
          }
LAB_001de6dc:
          if (bVar5) goto LAB_001de6e0;
          bVar5 = false;
        }
        else {
          if (p_Var14[1]._M_color == 0x1e) {
            _Var28._M_head_impl = p_Var14[2]._M_color;
            plVar2 = *(long **)(local_2b0._0_8_ +
                               ((ulong)_Var28._M_head_impl % (ulong)local_2b0._8_8_) * 8);
            plVar18 = (long *)0x0;
            if ((plVar2 != (long *)0x0) &&
               (plVar18 = plVar2, plVar32 = (long *)*plVar2,
               _Var28._M_head_impl != *(_Rb_tree_color *)((long *)*plVar2 + 1))) {
              while (plVar2 = (long *)*plVar32, plVar2 != (long *)0x0) {
                plVar18 = (long *)0x0;
                if (((ulong)*(_Rb_tree_color *)(plVar2 + 1) % (ulong)local_2b0._8_8_ !=
                     (ulong)_Var28._M_head_impl % (ulong)local_2b0._8_8_) ||
                   (plVar18 = plVar32, plVar32 = plVar2,
                   _Var28._M_head_impl == *(_Rb_tree_color *)(plVar2 + 1))) goto LAB_001de5af;
              }
              plVar18 = (long *)0x0;
            }
LAB_001de5af:
            if (plVar18 == (long *)0x0) {
              lVar24 = 0;
            }
            else {
              lVar24 = *plVar18;
            }
            if (lVar24 == 0) {
              _Var26 = (p_Var14[1]._M_parent)->_M_color;
              this = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)local_2b0;
              goto LAB_001de6cb;
            }
            bVar5 = true;
            if (*(_Rb_tree_color *)(lVar24 + 0xc) != (p_Var14[1]._M_parent)->_M_color) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_208,pVVar27,SPV_ERROR_INVALID_DATA,pIVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Member index ",0xd);
              std::ostream::operator<<((DiagnosticStream *)local_208,p_Var14[2]._M_color);
              lVar24 = 0x25;
              pcVar29 = " has conflicting location assignments";
              goto LAB_001de69a;
            }
            goto LAB_001de6dc;
          }
LAB_001de6e0:
          bVar5 = true;
        }
        if (!bVar5) break;
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
        bVar38 = (_Rb_tree_header *)p_Var14 == p_Var33;
      } while (!bVar38);
    }
    sVar25 = (spv_result_t)local_338;
    if (bVar38) {
      iVar22 = 0xd;
      if (0x10 < (ulong)((long)(pIVar12->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pIVar12->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        local_2f8 = CONCAT44(local_2f8._4_4_,(SVar6 == Output) + 0x2211);
        index = 1;
        do {
          _Var36.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
               (_Head_base<2UL,_unsigned_int,_false>)((int)index - 1);
          plVar2 = *(long **)(local_2b0._0_8_ +
                             ((ulong)(uint)_Var36.super__Head_base<2UL,_unsigned_int,_false>.
                                           _M_head_impl % (ulong)local_2b0._8_8_) * 8);
          plVar18 = (long *)0x0;
          if ((plVar2 != (long *)0x0) &&
             (plVar18 = plVar2, plVar32 = (long *)*plVar2,
             _Var36.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl !=
             (_Head_base<2UL,_unsigned_int,_false>)*(uint *)((long *)*plVar2 + 1))) {
            while (plVar2 = (long *)*plVar32, plVar2 != (long *)0x0) {
              plVar18 = (long *)0x0;
              if (((ulong)*(uint *)(plVar2 + 1) % (ulong)local_2b0._8_8_ !=
                   (ulong)(uint)_Var36.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl %
                   (ulong)local_2b0._8_8_) ||
                 (plVar18 = plVar32, plVar32 = plVar2,
                 _Var36.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl ==
                 (_Head_base<2UL,_unsigned_int,_false>)*(uint *)(plVar2 + 1))) goto LAB_001de7b6;
            }
            plVar18 = (long *)0x0;
          }
LAB_001de7b6:
          if (plVar18 == (long *)0x0) {
            lVar24 = 0;
          }
          else {
            lVar24 = *plVar18;
          }
          if (lVar24 == 0) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_208,pVVar27,SPV_ERROR_INVALID_DATA,pIVar12);
            ValidationState_t::VkErrorID_abi_cxx11_(&local_2e8,pVVar27,0x1337,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,
                       (char *)CONCAT44(local_2e8._M_dataplus._M_p._4_4_,
                                        (uint)local_2e8._M_dataplus._M_p),local_2e8._M_string_length
                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Member index ",0xd);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," is missing a location assignment",0x21);
            sVar25 = local_38;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_2e8._M_dataplus._M_p._4_4_,(uint)local_2e8._M_dataplus._M_p) !=
                &local_2e8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_2e8._M_dataplus._M_p._4_4_,
                                       (uint)local_2e8._M_dataplus._M_p),
                              local_2e8.field_2._M_allocated_capacity + 1);
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            iVar22 = 1;
          }
          else {
            uVar7 = *(uint *)(lVar24 + 0xc);
            uVar9 = Instruction::GetOperandAs<unsigned_int>(pIVar12,index);
            type = ValidationState_t::FindDef(pVVar27,uVar9);
            local_30c = 0;
            sVar10 = NumConsumedLocations(pVVar27,type,&local_30c);
            if (sVar10 == SPV_SUCCESS) {
              local_338 = (Instruction *)(ulong)uVar7;
              uVar11 = NumConsumedComponents(pVVar27,type);
              local_330 = (Instruction *)CONCAT44(extraout_var,uVar11);
              local_208._0_4_ = _Var36.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
              sVar19 = std::
                       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::count(&local_240,(key_type_conflict *)local_208);
              if (sVar19 == 0) {
                local_318 = 0;
              }
              else {
                pmVar20 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&local_240,(key_type *)local_208);
                local_318 = (ulong)*pmVar20;
              }
              uVar7 = (uint)local_338;
              uVar9 = uVar7 * 4;
              pVVar27 = local_348;
              if (uVar9 < 0x4000) {
                iVar22 = (int)local_330;
                uVar21 = (uint)local_318;
                if ((iVar22 - 1U < 3) && ((type->inst_).opcode == 0x1c)) {
                  if (uVar7 < local_30c + uVar7) {
                    uVar7 = iVar22 + uVar21;
                    local_308 = CONCAT71(local_308._1_7_,uVar21 < uVar7);
                    local_2c8 = local_318;
                    uVar35 = (ulong)uVar9;
                    local_330 = local_338;
                    local_300 = index;
                    do {
                      local_31c = 0x13;
                      uVar34 = local_2c8;
                      bVar37 = (byte)local_308;
                      local_2f0 = uVar35;
                      if ((uint)local_318 < uVar7) {
                        do {
                          local_34c = (int)uVar34 + (int)uVar35;
                          _local_208 = local_328;
                          pVar40 = std::
                                   _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                   ::
                                   _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                             ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                               *)local_328,&local_34c,local_208);
                          pVVar27 = local_348;
                          if (((undefined1  [16])pVar40 & (undefined1  [16])0x1) ==
                              (undefined1  [16])0x0) {
                            ValidationState_t::diag
                                      ((DiagnosticStream *)local_208,local_348,
                                       SPV_ERROR_INVALID_DATA,local_2c0);
                            ValidationState_t::VkErrorID_abi_cxx11_
                                      (&local_2e8,pVVar27,(uint32_t)local_2f8,(char *)0x0);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_208,
                                       (char *)CONCAT44(local_2e8._M_dataplus._M_p._4_4_,
                                                        (uint)local_2e8._M_dataplus._M_p),
                                       local_2e8._M_string_length);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_208,"Entry-point has conflicting ",0x1c);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_208,(char *)local_270,local_268);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_208," location assignment at location ",0x21
                                      );
                            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_208,", component ",0xc);
                            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                            sVar25 = local_38;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(local_2e8._M_dataplus._M_p._4_4_,
                                            (uint)local_2e8._M_dataplus._M_p) != &local_2e8.field_2)
                            {
                              operator_delete((undefined1 *)
                                              CONCAT44(local_2e8._M_dataplus._M_p._4_4_,
                                                       (uint)local_2e8._M_dataplus._M_p),
                                              local_2e8.field_2._M_allocated_capacity + 1);
                            }
                            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                            uVar35 = local_2f0;
                          }
                          if (((undefined1  [16])pVar40 & (undefined1  [16])0x1) ==
                              (undefined1  [16])0x0) {
                            local_31c = 1;
                            break;
                          }
                          uVar34 = uVar34 + 1;
                          bVar37 = uVar34 < uVar7;
                        } while (uVar34 != uVar7);
                      }
                      index = local_300;
                      iVar22 = local_31c;
                      if ((bVar37 & 1) != 0) goto LAB_001ded3b;
                      local_330 = (Instruction *)
                                  ((long)&(local_330->words_).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1);
                      uVar35 = uVar35 + 4;
                    } while (local_330 < (Instruction *)(ulong)(local_30c + (int)local_338));
                  }
                  iVar22 = 0x10;
LAB_001ded3b:
                  pVVar27 = local_348;
                  if (iVar22 == 0x10) {
LAB_001decfa:
                    iVar22 = 0;
                  }
                }
                else {
                  uVar4 = uVar21 + uVar9 + iVar22;
                  local_34c = uVar21 + uVar9;
                  if (iVar22 == 0) {
                    uVar4 = (local_30c + uVar7) * 4;
                    local_34c = uVar9;
                  }
                  iVar22 = 0;
                  bVar38 = local_34c < uVar4;
                  if (bVar38) {
                    do {
                      _local_208 = local_328;
                      pVar40 = std::
                               _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                               ::
                               _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                         ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                           *)local_328,&local_34c,local_208);
                      pVVar27 = local_348;
                      if (((undefined1  [16])pVar40 & (undefined1  [16])0x1) ==
                          (undefined1  [16])0x0) {
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_208,local_348,SPV_ERROR_INVALID_DATA,
                                   local_2c0);
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&local_2e8,pVVar27,(uint32_t)local_2f8,(char *)0x0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_208,
                                   (char *)CONCAT44(local_2e8._M_dataplus._M_p._4_4_,
                                                    (uint)local_2e8._M_dataplus._M_p),
                                   local_2e8._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_208,"Entry-point has conflicting ",0x1c);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_208,(char *)local_270,local_268);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_208," location assignment at location ",0x21);
                        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_208,", component ",0xc);
                        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                        sVar25 = local_38;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_2e8._M_dataplus._M_p._4_4_,
                                        (uint)local_2e8._M_dataplus._M_p) != &local_2e8.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_2e8._M_dataplus._M_p._4_4_,
                                                   (uint)local_2e8._M_dataplus._M_p),
                                          local_2e8.field_2._M_allocated_capacity + 1);
                        }
                        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                        iVar22 = 1;
                        goto LAB_001deceb;
                      }
                      local_34c = local_34c + 1;
                      bVar38 = local_34c < uVar4;
                    } while (bVar38);
                    iVar22 = 0;
                  }
LAB_001deceb:
                  if (!bVar38) goto LAB_001decfa;
                }
              }
              else {
                iVar22 = 0xf;
              }
            }
            else {
              iVar22 = 1;
              sVar25 = sVar10;
            }
          }
          if ((iVar22 != 0xf) && (iVar22 != 0)) goto LAB_001def8c;
          index = (size_t)((int)index + 1);
        } while (index < (ulong)((long)(pIVar12->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pIVar12->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
        iVar22 = 0xd;
      }
LAB_001def8c:
      uVar39 = iVar22 == 0 || iVar22 == 0xd;
    }
    else {
      uVar39 = false;
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_240);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_2b0);
  }
  else {
    if ((pIVar12->inst_).opcode == 0x1c) {
      uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar12,2);
      ValidationState_t::EvalInt32IfConst
                ((tuple<bool,_bool,_unsigned_int> *)local_208,pVVar27,uVar7);
      if ((cStack_203 == '\x01') && (local_208[4] != false)) {
        local_328.super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
        _M_head_impl = (_Head_base<2UL,_unsigned_int,_false>)
                       (_Head_base<2UL,_unsigned_int,_false>)local_208._0_4_;
      }
      else {
        local_328.super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
        _M_head_impl = (_Head_base<2UL,_unsigned_int,_false>)0x1;
      }
      sVar25 = (spv_result_t)local_338;
      uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar12,1);
      pIVar12 = ValidationState_t::FindDef(pVVar27,uVar7);
    }
    else {
      local_328.super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
      _M_head_impl = (_Head_base<2UL,_unsigned_int,_false>)0x1;
      sVar25 = (spv_result_t)local_338;
    }
    local_240._M_buckets = (__buckets_ptr)((ulong)local_240._M_buckets._4_4_ << 0x20);
    sVar10 = NumConsumedLocations(pVVar27,pIVar12,(uint32_t *)&local_240);
    if (sVar10 == SPV_SUCCESS) {
      uVar11 = NumConsumedComponents(pVVar27,pIVar12);
      if (local_328.super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
          _M_head_impl == 0) {
        uVar39 = true;
      }
      else {
        local_330 = (Instruction *)CONCAT44(local_330._4_4_,(SVar6 == Output) + 0x2211);
        uVar7 = 0;
        _Var28 = local_328.super__Tuple_impl<2UL,_unsigned_int>.
                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
        do {
          iVar30 = (int)local_240._M_buckets * uVar7 + (int)local_2f0;
          uVar9 = iVar30 * 4;
          iVar22 = 5;
          if (uVar9 < 0x4000) {
            local_2e8._M_dataplus._M_p._0_4_ = (int)local_308 + uVar9;
            uVar21 = (uint)local_2e8._M_dataplus._M_p + uVar11;
            if (uVar11 == 0) {
              local_2e8._M_dataplus._M_p._0_4_ = uVar9;
              uVar21 = (iVar30 + (int)local_240._M_buckets) * 4;
            }
            iVar22 = 0;
            if ((uint)local_2e8._M_dataplus._M_p < uVar21) {
              do {
                _local_208 = (_Tuple_impl<1UL,_bool,_unsigned_int>)locations;
                pVar40 = std::
                         _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                         ::
                         _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                   ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                     *)locations,&local_2e8,(DiagnosticStream *)local_208);
                pVVar27 = local_348;
                if (((undefined1  [16])pVar40 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,local_348,SPV_ERROR_INVALID_DATA,
                             local_2c0);
                  ValidationState_t::VkErrorID_abi_cxx11_
                            ((string *)local_2b0,pVVar27,(uint32_t)local_330,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,(char *)local_2b0._0_8_,local_2b0._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,"Entry-point has conflicting ",0x1c);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,(char *)local_270,local_268);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," location assignment at location ",0x21);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,", component ",0xc);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                  sVar25 = local_38;
                  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
                  }
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                  iVar22 = 1;
                  break;
                }
                local_2e8._M_dataplus._M_p._0_4_ = (uint)local_2e8._M_dataplus._M_p + 1;
              } while ((uint)local_2e8._M_dataplus._M_p < uVar21);
              _Var28 = local_328.super__Tuple_impl<2UL,_unsigned_int>.
                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
            }
          }
          if (iVar22 != 0) goto LAB_001def7f;
          uVar7 = uVar7 + 1;
        } while (uVar7 != _Var28._M_head_impl);
        iVar22 = 5;
LAB_001def7f:
        uVar39 = iVar22 == 5;
      }
    }
    else {
      uVar39 = false;
      sVar25 = sVar10;
    }
  }
  if ((bool)uVar39) {
    sVar25 = SPV_SUCCESS;
  }
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  return sVar25;
}

Assistant:

spv_result_t GetLocationsForVariable(
    ValidationState_t& _, const Instruction* entry_point,
    const Instruction* variable, std::unordered_set<uint32_t>* locations,
    std::unordered_set<uint32_t>* output_index1_locations) {
  const bool is_fragment = entry_point->GetOperandAs<spv::ExecutionModel>(0) ==
                           spv::ExecutionModel::Fragment;
  const auto sc_index = 2u;
  const bool is_output = variable->GetOperandAs<spv::StorageClass>(sc_index) ==
                         spv::StorageClass::Output;
  auto ptr_type_id = variable->GetOperandAs<uint32_t>(0);
  auto ptr_type = _.FindDef(ptr_type_id);
  auto type_id = ptr_type->GetOperandAs<uint32_t>(2);
  auto type = _.FindDef(type_id);

  // Check for Location, Component and Index decorations on the variable. The
  // validator allows duplicate decorations if the location/component/index are
  // equal. Also track Patch and PerTaskNV decorations.
  bool has_location = false;
  uint32_t location = 0;
  uint32_t component = 0;
  bool has_index = false;
  uint32_t index = 0;
  bool has_patch = false;
  bool has_per_task_nv = false;
  bool has_per_vertex_khr = false;
  // Duplicate Location, Component, Index are checked elsewhere.
  for (auto& dec : _.id_decorations(variable->id())) {
    if (dec.dec_type() == spv::Decoration::Location) {
      has_location = true;
      location = dec.params()[0];
    } else if (dec.dec_type() == spv::Decoration::Component) {
      component = dec.params()[0];
    } else if (dec.dec_type() == spv::Decoration::Index) {
      if (!is_output || !is_fragment) {
        return _.diag(SPV_ERROR_INVALID_DATA, variable)
               << "Index can only be applied to Fragment output variables";
      }
      has_index = true;
      index = dec.params()[0];
    } else if (dec.dec_type() == spv::Decoration::BuiltIn) {
      // Don't check built-ins.
      return SPV_SUCCESS;
    } else if (dec.dec_type() == spv::Decoration::Patch) {
      has_patch = true;
    } else if (dec.dec_type() == spv::Decoration::PerTaskNV) {
      has_per_task_nv = true;
    } else if (dec.dec_type() == spv::Decoration::PerVertexKHR) {
      if (!is_fragment) {
        return _.diag(SPV_ERROR_INVALID_DATA, variable)
               << _.VkErrorID(6777)
               << "PerVertexKHR can only be applied to Fragment Execution "
                  "Models";
      }
      if (type->opcode() != spv::Op::OpTypeArray &&
          type->opcode() != spv::Op::OpTypeRuntimeArray) {
        return _.diag(SPV_ERROR_INVALID_DATA, variable)
               << _.VkErrorID(6778)
               << "PerVertexKHR must be declared as arrays";
      }
      has_per_vertex_khr = true;
    }
  }

  // Vulkan 14.1.3: Tessellation control and mesh per-vertex outputs and
  // tessellation control, evaluation and geometry per-vertex inputs have a
  // layer of arraying that is not included in interface matching.
  bool is_arrayed = false;
  switch (entry_point->GetOperandAs<spv::ExecutionModel>(0)) {
    case spv::ExecutionModel::TessellationControl:
      if (!has_patch) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::TessellationEvaluation:
      if (!is_output && !has_patch) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::Geometry:
      if (!is_output) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::Fragment:
      if (!is_output && has_per_vertex_khr) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::MeshNV:
      if (is_output && !has_per_task_nv) {
        is_arrayed = true;
      }
      break;
    default:
      break;
  }

  // Unpack arrayness.
  if (is_arrayed && (type->opcode() == spv::Op::OpTypeArray ||
                     type->opcode() == spv::Op::OpTypeRuntimeArray)) {
    type_id = type->GetOperandAs<uint32_t>(1);
    type = _.FindDef(type_id);
  }

  if (type->opcode() == spv::Op::OpTypeStruct) {
    // Don't check built-ins.
    if (_.HasDecoration(type_id, spv::Decoration::BuiltIn)) return SPV_SUCCESS;
  }

  // Only block-decorated structs don't need a location on the variable.
  const bool is_block = _.HasDecoration(type_id, spv::Decoration::Block);
  if (!has_location && !is_block) {
    const auto vuid = (type->opcode() == spv::Op::OpTypeStruct) ? 4917 : 4916;
    return _.diag(SPV_ERROR_INVALID_DATA, variable)
           << _.VkErrorID(vuid) << "Variable must be decorated with a location";
  }

  const std::string storage_class = is_output ? "output" : "input";
  if (has_location) {
    auto sub_type = type;
    bool is_int = false;
    bool is_const = false;
    uint32_t array_size = 1;
    // If the variable is still arrayed, mark the locations/components per
    // index.
    if (type->opcode() == spv::Op::OpTypeArray) {
      // Determine the array size if possible and get the element type.
      std::tie(is_int, is_const, array_size) =
          _.EvalInt32IfConst(type->GetOperandAs<uint32_t>(2));
      if (!is_int || !is_const) array_size = 1;
      auto sub_type_id = type->GetOperandAs<uint32_t>(1);
      sub_type = _.FindDef(sub_type_id);
    }

    uint32_t num_locations = 0;
    if (auto error = NumConsumedLocations(_, sub_type, &num_locations))
      return error;
    uint32_t num_components = NumConsumedComponents(_, sub_type);

    for (uint32_t array_idx = 0; array_idx < array_size; ++array_idx) {
      uint32_t array_location = location + (num_locations * array_idx);
      uint32_t start = array_location * 4;
      if (kMaxLocations <= start) {
        // Too many locations, give up.
        break;
      }

      uint32_t end = (array_location + num_locations) * 4;
      if (num_components != 0) {
        start += component;
        end = array_location * 4 + component + num_components;
      }

      auto locs = locations;
      if (has_index && index == 1) locs = output_index1_locations;

      for (uint32_t i = start; i < end; ++i) {
        if (!locs->insert(i).second) {
          return _.diag(SPV_ERROR_INVALID_DATA, entry_point)
                 << (is_output ? _.VkErrorID(8722) : _.VkErrorID(8721))
                 << "Entry-point has conflicting " << storage_class
                 << " location assignment at location " << i / 4
                 << ", component " << i % 4;
        }
      }
    }
  } else {
    // For Block-decorated structs with no location assigned to the variable,
    // each member of the block must be assigned a location. Also record any
    // member component assignments. The validator allows duplicate decorations
    // if they agree on the location/component.
    std::unordered_map<uint32_t, uint32_t> member_locations;
    std::unordered_map<uint32_t, uint32_t> member_components;
    for (auto& dec : _.id_decorations(type_id)) {
      if (dec.dec_type() == spv::Decoration::Location) {
        auto where = member_locations.find(dec.struct_member_index());
        if (where == member_locations.end()) {
          member_locations[dec.struct_member_index()] = dec.params()[0];
        } else if (where->second != dec.params()[0]) {
          return _.diag(SPV_ERROR_INVALID_DATA, type)
                 << "Member index " << dec.struct_member_index()
                 << " has conflicting location assignments";
        }
      } else if (dec.dec_type() == spv::Decoration::Component) {
        auto where = member_components.find(dec.struct_member_index());
        if (where == member_components.end()) {
          member_components[dec.struct_member_index()] = dec.params()[0];
        } else if (where->second != dec.params()[0]) {
          return _.diag(SPV_ERROR_INVALID_DATA, type)
                 << "Member index " << dec.struct_member_index()
                 << " has conflicting component assignments";
        }
      }
    }

    for (uint32_t i = 1; i < type->operands().size(); ++i) {
      auto where = member_locations.find(i - 1);
      if (where == member_locations.end()) {
        return _.diag(SPV_ERROR_INVALID_DATA, type)
               << _.VkErrorID(4919) << "Member index " << i - 1
               << " is missing a location assignment";
      }

      location = where->second;
      auto member = _.FindDef(type->GetOperandAs<uint32_t>(i));
      uint32_t num_locations = 0;
      if (auto error = NumConsumedLocations(_, member, &num_locations))
        return error;

      // If the component is not specified, it is assumed to be zero.
      uint32_t num_components = NumConsumedComponents(_, member);
      component = 0;
      if (member_components.count(i - 1)) {
        component = member_components[i - 1];
      }

      uint32_t start = location * 4;
      if (kMaxLocations <= start) {
        // Too many locations, give up.
        continue;
      }

      if (member->opcode() == spv::Op::OpTypeArray && num_components >= 1 &&
          num_components < 4) {
        // When an array has an element that takes less than a location in
        // size, calculate the used locations in a strided manner.
        for (uint32_t l = location; l < num_locations + location; ++l) {
          for (uint32_t c = component; c < component + num_components; ++c) {
            uint32_t check = 4 * l + c;
            if (!locations->insert(check).second) {
              return _.diag(SPV_ERROR_INVALID_DATA, entry_point)
                     << (is_output ? _.VkErrorID(8722) : _.VkErrorID(8721))
                     << "Entry-point has conflicting " << storage_class
                     << " location assignment at location " << l
                     << ", component " << c;
            }
          }
        }
      } else {
        // TODO: There is a hole here is the member is an array of 3- or
        // 4-element vectors of 64-bit types.
        uint32_t end = (location + num_locations) * 4;
        if (num_components != 0) {
          start += component;
          end = location * 4 + component + num_components;
        }
        for (uint32_t l = start; l < end; ++l) {
          if (!locations->insert(l).second) {
            return _.diag(SPV_ERROR_INVALID_DATA, entry_point)
                   << (is_output ? _.VkErrorID(8722) : _.VkErrorID(8721))
                   << "Entry-point has conflicting " << storage_class
                   << " location assignment at location " << l / 4
                   << ", component " << l % 4;
          }
        }
      }
    }
  }

  return SPV_SUCCESS;
}